

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O2

exr_result_t exr_get_zip_compression_level(exr_const_context_t ctxt,int part_index,int *level)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (level != (int *)0x0) {
      *level = *(int *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 0xb8);
      return 0;
    }
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,3);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_get_zip_compression_level (
    exr_const_context_t ctxt, int part_index, int* level)
{
    int l;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    l = part->zip_compression_level;
    EXR_UNLOCK_WRITE (pctxt);

    if (!level) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);
    *level = l;
    return EXR_ERR_SUCCESS;
}